

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Token * __thiscall Parser::peekToken(Parser *this,int delta)

{
  ulong uVar1;
  undefined8 extraout_RAX;
  ulong uVar2;
  Parser *this_00;
  undefined1 local_30 [32];
  
  uVar1 = (long)delta + (long)this->mTokenIndex;
  uVar2 = ((long)(this->mTokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->mTokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  if (uVar1 <= uVar2 && uVar2 - uVar1 != 0) {
    return (this->mTokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start + uVar1;
  }
  this_00 = (Parser *)local_30;
  local_30._0_8_ = (CalculationEngine *)(local_30 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Reached end of tokens.","");
  parseError(this_00,(string *)local_30);
  if ((CalculationEngine *)local_30._0_8_ != (CalculationEngine *)(local_30 + 0x10)) {
    operator_delete((void *)local_30._0_8_,(ulong)(local_30._16_8_ + 1));
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Token& Parser::peekToken(int delta) {
	int nextTokenIndex = mTokenIndex + delta;

	if ((std::size_t)nextTokenIndex >= mTokens.size()) {
		parseError("Reached end of tokens.");
	}

	return mTokens[nextTokenIndex];
}